

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_msg_header_chop_u16(nng_msg *msg,uint16_t *val)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  
  sVar3 = nni_msg_header_len(msg);
  if (sVar3 < 2) {
    iVar2 = 3;
  }
  else {
    pvVar4 = nni_msg_header(msg);
    sVar3 = nni_msg_header_len(msg);
    uVar1 = *(ushort *)((long)pvVar4 + (sVar3 - 2));
    *val = uVar1 << 8 | uVar1 >> 8;
    nni_msg_header_chop(msg,2);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_header_chop_u16(nng_msg *msg, uint16_t *val)
{
	uint8_t *header;
	uint16_t v;
	if (nng_msg_header_len(msg) < sizeof(*val)) {
		return (NNG_EINVAL);
	}
	header = nng_msg_header(msg);
	header += nng_msg_header_len(msg);
	header -= sizeof(v);
	NNI_GET16(header, v);
	*val = v;
	nni_msg_header_chop(msg, sizeof(v));
	return (0);
}